

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# polymer.cpp
# Opt level: O1

void __thiscall Polymer::CheckBehind(Polymer *this,int old_start,int new_start)

{
  int iVar1;
  BindingSite *pBVar2;
  element_type *peVar3;
  long lVar4;
  bool bVar5;
  Interval<std::shared_ptr<ReleaseSite>,_unsigned_long> *interval;
  SpeciesTracker *this_00;
  _Alloc_hider _Var6;
  ulong uVar7;
  pointer pIVar8;
  pointer pIVar9;
  vector<Interval<std::shared_ptr<ReleaseSite>,_unsigned_long>,_std::allocator<Interval<std::shared_ptr<ReleaseSite>,_unsigned_long>_>_>
  term_results;
  vector<Interval<std::shared_ptr<BindingSite>,_unsigned_long>,_std::allocator<Interval<std::shared_ptr<BindingSite>,_unsigned_long>_>_>
  results;
  string local_a8;
  unsigned_long local_88;
  unsigned_long local_80;
  pointer local_78;
  ulong local_70;
  string local_68;
  intervalVector local_48;
  
  uVar7 = (ulong)(uint)new_start;
  local_48.
  super__Vector_base<Interval<std::shared_ptr<BindingSite>,_unsigned_long>,_std::allocator<Interval<std::shared_ptr<BindingSite>,_unsigned_long>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_48.
  super__Vector_base<Interval<std::shared_ptr<BindingSite>,_unsigned_long>,_std::allocator<Interval<std::shared_ptr<BindingSite>,_unsigned_long>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_48.
  super__Vector_base<Interval<std::shared_ptr<BindingSite>,_unsigned_long>,_std::allocator<Interval<std::shared_ptr<BindingSite>,_unsigned_long>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_80 = (unsigned_long)old_start;
  local_88 = (unsigned_long)(new_start + 1);
  IntervalTree<std::shared_ptr<BindingSite>,_unsigned_long>::findOverlapping
            (&this->binding_sites_,local_80,local_88,&local_48);
  if (local_48.
      super__Vector_base<Interval<std::shared_ptr<BindingSite>,_unsigned_long>,_std::allocator<Interval<std::shared_ptr<BindingSite>,_unsigned_long>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_48.
      super__Vector_base<Interval<std::shared_ptr<BindingSite>,_unsigned_long>,_std::allocator<Interval<std::shared_ptr<BindingSite>,_unsigned_long>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    local_78 = local_48.
               super__Vector_base<Interval<std::shared_ptr<BindingSite>,_unsigned_long>,_std::allocator<Interval<std::shared_ptr<BindingSite>,_unsigned_long>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    pIVar8 = local_48.
             super__Vector_base<Interval<std::shared_ptr<BindingSite>,_unsigned_long>,_std::allocator<Interval<std::shared_ptr<BindingSite>,_unsigned_long>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    pIVar9 = local_48.
             super__Vector_base<Interval<std::shared_ptr<BindingSite>,_unsigned_long>,_std::allocator<Interval<std::shared_ptr<BindingSite>,_unsigned_long>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    local_70 = uVar7;
    do {
      pBVar2 = (pIVar9->value).super___shared_ptr<BindingSite,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      if ((pBVar2->super_FixedElement).stop_ < (int)uVar7) {
        iVar1 = (pBVar2->super_FixedElement).covered_;
        if (0 < iVar1) {
          (pBVar2->super_FixedElement).covered_ = iVar1 + -1;
        }
        if ((0 < (pBVar2->super_FixedElement).old_covered_) &&
           ((pBVar2->super_FixedElement).covered_ == 0)) {
          local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,"__ribosome","");
          BindingSite::CheckInteraction(pBVar2,&local_a8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
            operator_delete(local_a8._M_dataplus._M_p);
          }
          LogUncover(this,&(((pIVar9->value).
                             super___shared_ptr<BindingSite,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                           super_FixedElement).name_);
          pBVar2 = (pIVar9->value).super___shared_ptr<BindingSite,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr;
          if ((pBVar2->super_FixedElement).first_exposure_ == false) {
            local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"__ribosome","");
            bVar5 = BindingSite::CheckInteraction(pBVar2,&local_68);
            uVar7 = local_70;
            pIVar8 = local_78;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_68._M_dataplus._M_p != &local_68.field_2) {
              operator_delete(local_68._M_dataplus._M_p);
            }
          }
          else {
            bVar5 = false;
            uVar7 = local_70;
            pIVar8 = local_78;
          }
          if (bVar5 != false) {
            this_00 = SpeciesTracker::Instance();
            SpeciesTracker::IncrementTranscript
                      (this_00,&(((pIVar9->value).
                                  super___shared_ptr<BindingSite,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                                 )->super_FixedElement).gene_,1);
            (((pIVar9->value).super___shared_ptr<BindingSite,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
            super_FixedElement).first_exposure_ = true;
            this->total_elements_ = this->total_elements_ + 1;
          }
        }
        peVar3 = (pIVar9->value).super___shared_ptr<BindingSite,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        (peVar3->super_FixedElement).old_covered_ = (peVar3->super_FixedElement).covered_;
      }
      new_start = (int)uVar7;
      pIVar9 = pIVar9 + 1;
    } while (pIVar9 != pIVar8);
  }
  local_a8._M_dataplus._M_p = (pointer)0x0;
  local_a8._M_string_length = 0;
  local_a8.field_2._M_allocated_capacity = 0;
  IntervalTree<std::shared_ptr<ReleaseSite>,_unsigned_long>::findOverlapping
            (&this->release_sites_,local_80,local_88,(intervalVector *)&local_a8);
  for (_Var6._M_p = local_a8._M_dataplus._M_p; _Var6._M_p != (pointer)local_a8._M_string_length;
      _Var6._M_p = _Var6._M_p + 0x20) {
    lVar4 = *(long *)(_Var6._M_p + 0x10);
    if (*(int *)(lVar4 + 0x3c) < new_start) {
      if (0 < *(int *)(lVar4 + 0x90)) {
        *(int *)(lVar4 + 0x90) = *(int *)(lVar4 + 0x90) + -1;
      }
      if (*(int *)(lVar4 + 0x90) == 0 && 0 < *(int *)(lVar4 + 0x94)) {
        *(undefined1 *)(lVar4 + 0x9d) = 0;
      }
      *(int *)(lVar4 + 0x94) = *(int *)(lVar4 + 0x90);
    }
  }
  std::
  vector<Interval<std::shared_ptr<ReleaseSite>,_unsigned_long>,_std::allocator<Interval<std::shared_ptr<ReleaseSite>,_unsigned_long>_>_>
  ::~vector((vector<Interval<std::shared_ptr<ReleaseSite>,_unsigned_long>,_std::allocator<Interval<std::shared_ptr<ReleaseSite>,_unsigned_long>_>_>
             *)&local_a8);
  std::
  vector<Interval<std::shared_ptr<BindingSite>,_unsigned_long>,_std::allocator<Interval<std::shared_ptr<BindingSite>,_unsigned_long>_>_>
  ::~vector(&local_48);
  return;
}

Assistant:

void Polymer::CheckBehind(int old_start, int new_start) {
  std::vector<Interval<BindingSite::Ptr>> results;
  binding_sites_.findOverlapping(old_start, new_start + 1, results);
  for (auto &interval : results) {
    // std::cout << interval.value->name() + " " +
    //                  std::to_string(interval.value->start()) +
    //                  std::to_string(interval.value->stop()) + " " +
    //                  std::to_string(new_start)
    //           << std::endl;
    if (interval.value->stop() < new_start) {
      // std::cout << interval.value->name() << std::endl;
      interval.value->Uncover();
      if (interval.value->WasUncovered()) {
        if (interval.value->CheckInteraction("__ribosome")) {
          // std::cout << "RBS uncovered!" << std::endl;
        }
        // Record changes that species was covered
        LogUncover(interval.value->name());
        // Is this a new transcript?
        if (!interval.value->first_exposure() &&
            interval.value->CheckInteraction("__ribosome")) {
          SpeciesTracker::Instance().IncrementTranscript(interval.value->gene(),
                                                         1);
          interval.value->first_exposure(true);
          total_elements_ += 1;
        }
      }
      interval.value->ResetState();
    }
  }

  std::vector<Interval<ReleaseSite::Ptr>> term_results;
  release_sites_.findOverlapping(old_start, new_start + 1, term_results);
  for (auto &interval : term_results) {
    if (interval.value->stop() < new_start) {
      interval.value->Uncover();
      // if (interval.value->name() != "stop_codon") {
      //   std::cout << "Terminator uncovered!" + interval.value->name()
      //             << std::endl;
      //   std::cout << interval.value->IsCovered() << std::endl;
      // }
      if (interval.value->WasUncovered()) {
        // Record changes that species was covered
        // LogUncover(interval.value->name());
        // Is this a terminator being uncovered?
        // if (interval.value->name() != "stop_codon") {
        //   std::cout << "Readthrough set to false!" << std::endl;
        // }
        interval.value->readthrough(false);
      }
      interval.value->ResetState();
    }
  }
}